

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

string * __thiscall google::StrError_abi_cxx11_(string *__return_storage_ptr__,google *this,int err)

{
  int iVar1;
  char local_88 [8];
  char buf [100];
  allocator<char> local_19;
  
  iVar1 = posix_strerror_r((int)this,local_88,100);
  if ((iVar1 < 0) || (local_88[0] == '\0')) {
    snprintf(local_88,100,"Error number %d",(ulong)this & 0xffffffff);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_88,&local_19);
  return __return_storage_ptr__;
}

Assistant:

string StrError(int err) {
  char buf[100];
  int rc = posix_strerror_r(err, buf, sizeof(buf));
  if ((rc < 0) || (buf[0] == '\000')) {
    snprintf(buf, sizeof(buf), "Error number %d", err);
  }
  return buf;
}